

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

htab_hash_t str_hash(tab_str_t str,void *arg)

{
  uint64_t uVar1;
  void *arg_local;
  
  uVar1 = mir_hash(str.str.s,str.str.len,0x42);
  return (htab_hash_t)uVar1;
}

Assistant:

static htab_hash_t str_hash (tab_str_t str, void *arg MIR_UNUSED) {
  return (htab_hash_t) mir_hash (str.str.s, str.str.len, 0x42);
}